

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  const_iterator *pcVar1;
  size_type sVar2;
  const_iterator cVar3;
  char *in_R9;
  SetKey *set;
  bool bVar4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_;
  TypeParam empty_ht;
  Hasher local_168;
  SetKey local_159;
  string local_158;
  AssertHelper local_138;
  pair<google::sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_130;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_e0;
  
  bVar4 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_130.first.ht._0_4_ = CONCAT31(local_130.first.ht._1_3_,bVar4);
  local_130.first.pos.row_begin._M_current =
       (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_e0,(internal *)&local_130,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x238,(char *)local_e0._vptr_BaseHashtableInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_e0._vptr_BaseHashtableInterface !=
        (_func_int **)
        ((long)&local_e0.ht_.rep.settings.
                super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                .super_Hasher + 8U)) {
      operator_delete(local_e0._vptr_BaseHashtableInterface);
    }
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  cVar3._M_current = local_130.first.pos.row_begin._M_current;
  if (local_130.first.pos.row_begin._M_current !=
      (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_130.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_130.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_130.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar3._M_current);
  }
  UniqueObjectHelper<std::__cxx11::string>((string *)&local_130,1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)&local_e0,this_00,(value_type *)&local_130);
  pcVar1 = &local_130.first.pos.row_end;
  if ((const_iterator *)CONCAT44(local_130.first.ht._4_4_,local_130.first.ht._0_4_) != pcVar1) {
    operator_delete((undefined1 *)CONCAT44(local_130.first.ht._4_4_,local_130.first.ht._0_4_));
  }
  bVar4 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) !=
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_130.first.ht._0_4_ = CONCAT31(local_130.first.ht._1_3_,bVar4);
  local_130.first.pos.row_begin._M_current =
       (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_e0,(internal *)&local_130,(AssertionResult *)"this->ht_.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x23b,(char *)local_e0._vptr_BaseHashtableInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_e0._vptr_BaseHashtableInterface !=
        (_func_int **)
        ((long)&local_e0.ht_.rep.settings.
                super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                .super_Hasher + 8U)) {
      operator_delete(local_e0._vptr_BaseHashtableInterface);
    }
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  cVar3._M_current = local_130.first.pos.row_begin._M_current;
  if (local_130.first.pos.row_begin._M_current !=
      (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_130.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_130.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_130.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar3._M_current);
  }
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::clear(&this_00->rep);
  bVar4 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_130.first.ht._0_4_ = CONCAT31(local_130.first.ht._1_3_,bVar4);
  local_130.first.pos.row_begin._M_current =
       (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_e0,(internal *)&local_130,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x23e,(char *)local_e0._vptr_BaseHashtableInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_e0._vptr_BaseHashtableInterface !=
        (_func_int **)
        ((long)&local_e0.ht_.rep.settings.
                super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                .super_Hasher + 8U)) {
      operator_delete(local_e0._vptr_BaseHashtableInterface);
    }
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  cVar3._M_current = local_130.first.pos.row_begin._M_current;
  if (local_130.first.pos.row_begin._M_current !=
      (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_130.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_130.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_130.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar3._M_current);
  }
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = (ulong)local_158._M_string_length._4_4_ << 0x20;
  local_168._0_8_ = (AssertHelperData *)0x0;
  local_168.num_compares_ = 0;
  local_130.first.ht._0_4_ = 0;
  local_130.first.pos.row_begin._M_current =
       (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_e0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c25208;
  set = &local_159;
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_e0.ht_.rep,0,(Hasher *)&local_158,&local_168,(Identity *)&local_138,set,
                     (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                      *)&local_130);
  local_e0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c25188;
  UniqueObjectHelper<std::__cxx11::string>(&local_158,1);
  google::
  sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::insert(&local_130,this_00,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&local_e0.ht_.rep);
  bVar4 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_158._M_dataplus._M_p._0_1_ = bVar4;
  local_158._M_string_length = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_130,(internal *)&local_158,(AssertionResult *)"this->ht_.empty()",
               "false","true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x243,(char *)CONCAT44(local_130.first.ht._4_4_,local_130.first.ht._0_4_));
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((const_iterator *)CONCAT44(local_130.first.ht._4_4_,local_130.first.ht._0_4_) != pcVar1) {
      operator_delete((undefined1 *)CONCAT44(local_130.first.ht._4_4_,local_130.first.ht._0_4_));
    }
    if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_168._0_8_ + 8))();
    }
  }
  sVar2 = local_158._M_string_length;
  if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_158._M_string_length !=
        (undefined8 *)(local_158._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_158._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface(&local_e0);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Empty) {
  EXPECT_TRUE(this->ht_.empty());

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());

  this->ht_.clear();
  EXPECT_TRUE(this->ht_.empty());

  TypeParam empty_ht;
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.swap(empty_ht);
  EXPECT_TRUE(this->ht_.empty());
}